

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfigTransform.cpp
# Opt level: O1

void __thiscall
xmrig::ConfigTransform::transformUint64(ConfigTransform *this,Document *doc,int key,uint64_t arg)

{
  uint64_t uVar1;
  
  if (key < 0x3fc) {
    if (key == 0x74) {
      this->m_threads = arg;
    }
    else if (key == 0x76) {
      uVar1 = 1;
      if (arg - 2 < 9) {
        uVar1 = *(uint64_t *)(&UINT_0018f830 + arg * 2);
      }
      this->m_intensity = uVar1;
      BaseTransform::set<bool>
                (&this->super_BaseTransform,doc,"cpu","hw-aes",arg - 5 < 3 || arg - 1 < 2);
      return;
    }
  }
  else {
    if (key == 0x3fd) {
      BaseTransform::set<unsigned_long>(&this->super_BaseTransform,doc,"cpu","priority",arg);
      return;
    }
    if (key == 0x3fc) {
      this->m_affinity = arg;
      return;
    }
  }
  return;
}

Assistant:

void xmrig::ConfigTransform::transformUint64(rapidjson::Document &doc, int key, uint64_t arg)
{
    using namespace rapidjson;

    switch (key) {
    case IConfig::CPUAffinityKey: /* --cpu-affinity */
        m_affinity = static_cast<int64_t>(arg);
        break;

    case IConfig::ThreadsKey: /* --threads */
        m_threads = arg;
        break;

    case IConfig::AVKey: /* --av */
        m_intensity = intensity(arg);
        set(doc, kCpu, "hw-aes", isHwAes(arg));
        break;

    case IConfig::CPUPriorityKey: /* --cpu-priority */
        return set(doc, kCpu, "priority", arg);

    default:
        break;
    }
}